

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void bsp_send(bsp_pid_t pid,void *tag,void *payload,bsp_size_t payload_nbytes)

{
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_send: can only be called within SPMD section\n");
  }
  if ((pid < 0) || (s_spmd->m_nprocs <= pid)) {
    bsp_abort("bsp_send: The source process ID does not exist\n");
  }
  if (payload_nbytes < 0) {
    bsp_abort("bsp_send: Payload size may not be negative\n");
    if (payload_nbytes == -1) {
      bsp_abort("bsp_send: Invalid payload size, because it is also used as end marker\n");
    }
  }
  bsplib::Bsmp::send(s_bsmp,pid,tag,(size_t)payload,payload_nbytes);
  return;
}

Assistant:

void bsp_send( bsp_pid_t pid, const void * tag, const void * payload,
        bsp_size_t payload_nbytes )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_send: can only be called within SPMD section\n");

    if (pid < 0 || pid >= s_spmd->nprocs())
        bsp_abort("bsp_send: The source process ID does not exist\n");

    if (payload_nbytes < 0 )
        bsp_abort("bsp_send: Payload size may not be negative\n");

    /* Note: this following check will never trigger, because it will already
     * have triggered the previous check, since bsp_size_t is a signed integer.
     * It is left in as a reminder in the event that someone changes bsp_size_t
     * to an unsigned type in the future. */
    if (payload_nbytes == bsp_size_t(-1))
        bsp_abort("bsp_send: Invalid payload size, because it is also "
                 "used as end marker\n");

#ifdef PROFILE
    TicToc t( TicToc::BSMP, s_bsmp->send_tag_size() + payload_nbytes );
#endif

    s_bsmp->send( pid, tag, payload, payload_nbytes );
}